

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  pointer ppMVar1;
  pointer ppMVar2;
  Expr *pEVar3;
  ModuleField *pMVar4;
  Limits *pLVar5;
  _func_int ***ppp_Var6;
  undefined8 uVar7;
  DataSegmentModuleField *pDVar8;
  bool bVar9;
  Result RVar10;
  _Head_base<0UL,_wabt::Import_*,_false> import;
  ulong uVar11;
  pointer *__ptr;
  Enum EVar12;
  __single_object data_segment_field;
  string name;
  Location loc;
  ModuleFieldList export_fields;
  undefined1 local_138 [16];
  anon_union_16_2_ecfd7102_for_Location_1 local_128;
  intrusive_list<wabt::Expr> *local_110;
  DataSegmentModuleField *local_108;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_100;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_f8;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_f0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Location local_b8;
  ModuleFieldList local_98;
  Var local_78;
  
  RVar10 = Expect(this,Lpar);
  if (RVar10.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)&local_78,this);
  uStack_d0 = (char *)CONCAT44(local_78.loc.filename._M_str._4_4_,local_78.loc.filename._M_str._0_4_
                              );
  local_c8 = CONCAT44(local_78.loc.field_1.field_0.first_column,local_78.loc.field_1.field_0.line);
  uStack_c0 = CONCAT44(local_78.loc.field_1._12_4_,local_78.loc.field_1.field_0.last_column);
  local_d8 = (_func_int **)local_78.loc.filename._M_len;
  RVar10 = Expect(this,Memory);
  if (RVar10.enum_ == Error) {
    return (Result)Error;
  }
  local_138._8_8_ = local_128.field2 + 8;
  local_128.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
  local_128.field2[8] = 0;
  ParseBindVarOpt(this,(string *)(local_138 + 8));
  local_98.size_ = 0;
  local_98.first_ = (ModuleField *)0x0;
  local_98.last_ = (ModuleField *)0x0;
  RVar10 = ParseInlineExports(this,&local_98,Memory);
  EVar12 = Error;
  if (RVar10.enum_ == Error) goto LAB_001342bc;
  bVar9 = PeekMatchLpar(this,Import);
  if (bVar9) {
    CheckImportOrdering(this,module);
    import._M_head_impl = (Import *)operator_new(0x88);
    ((import._M_head_impl)->module_name)._M_dataplus._M_p =
         (pointer)&((import._M_head_impl)->module_name).field_2;
    ((import._M_head_impl)->module_name)._M_string_length = 0;
    ((import._M_head_impl)->module_name).field_2._M_local_buf[0] = '\0';
    ((import._M_head_impl)->field_name)._M_dataplus._M_p =
         (pointer)&((import._M_head_impl)->field_name).field_2;
    ((import._M_head_impl)->field_name)._M_string_length = 0;
    ((import._M_head_impl)->field_name).field_2._M_local_buf[0] = '\0';
    (import._M_head_impl)->kind_ = Memory;
    (import._M_head_impl)->_vptr_Import = (_func_int **)&PTR__MemoryImport_0018e4e8;
    import._M_head_impl[1]._vptr_Import =
         (_func_int **)&import._M_head_impl[1].module_name._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(import._M_head_impl + 1),local_138._8_8_,
               (char *)(local_138._8_8_ + (long)local_128.field_1.offset));
    *(undefined8 *)((long)&import._M_head_impl[1].module_name.field_2 + 8) = 0;
    import._M_head_impl[1].field_name._M_dataplus._M_p = (pointer)0x0;
    *(undefined4 *)((long)&import._M_head_impl[1].field_name._M_dataplus._M_p + 7) = 0;
    RVar10 = ParseInlineImport(this,import._M_head_impl);
    if (RVar10.enum_ != Error) {
      pLVar5 = (Limits *)((long)&import._M_head_impl[1].module_name.field_2 + 8);
      RVar10 = ParseLimitsIndex(this,pLVar5);
      if ((RVar10.enum_ != Error) && (RVar10 = ParseLimits(this,pLVar5), RVar10.enum_ != Error)) {
        GetToken((Token *)&local_78,this);
        local_b8.filename._M_str =
             (char *)CONCAT44(local_78.loc.filename._M_str._4_4_,local_78.loc.filename._M_str._0_4_)
        ;
        local_b8.field_1.field_0.first_column = local_78.loc.field_1.field_0.first_column;
        local_b8.field_1.field_0.line = local_78.loc.field_1.field_0.line;
        local_b8.field_1._8_8_ =
             CONCAT44(local_78.loc.field_1._12_4_,local_78.loc.field_1.field_0.last_column);
        local_b8.filename._M_len = local_78.loc.filename._M_len;
        local_e0._M_head_impl = (ImportModuleField *)operator_new(0x48);
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.super_intrusive_list_base<wabt::ModuleField>.next_ = (ModuleField *)0x0;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.super_intrusive_list_base<wabt::ModuleField>.prev_ = (ModuleField *)0x0;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ModuleField_0018d9f0;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.filename._M_len = local_b8.filename._M_len;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.filename._M_str = local_b8.filename._M_str;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.loc.field_1.field_1.offset = (size_t)local_b8.field_1.field_1.offset;
        *(undefined8 *)
         ((long)&((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
                 super_ModuleField.loc.field_1 + 8) = local_b8.field_1._8_8_;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField.type_ = Import;
        ((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
        super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ImportModuleField_0018e1f8;
        ((local_e0._M_head_impl)->import)._M_t.
        super___uniq_ptr_impl<wabt::Import,_std::default_delete<wabt::Import>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Import_*,_std::default_delete<wabt::Import>_>.
        super__Head_base<0UL,_wabt::Import_*,_false>._M_head_impl = import._M_head_impl;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_e0);
        if (local_e0._M_head_impl != (ImportModuleField *)0x0) {
          (*((local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>).
            super_ModuleField._vptr_ModuleField[1])();
        }
        local_e0._M_head_impl = (ImportModuleField *)0x0;
LAB_00134282:
        anon_unknown_1::AppendInlineExportFields
                  (module,&local_98,
                   (int)((ulong)((long)(module->memories).
                                       super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->memories).
                                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
        RVar10 = Expect(this,Rpar);
        EVar12 = (Enum)(RVar10.enum_ == Error);
        goto LAB_001342bc;
      }
    }
  }
  else {
    import._M_head_impl = (Import *)operator_new(0x78);
    (((string *)
     &(((MemoryModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>)
      .super_ModuleField.super_intrusive_list_base<wabt::ModuleField>)->_M_dataplus)._M_p =
         (pointer)0x0;
    ((string *)
    &(((MemoryModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
     super_ModuleField.super_intrusive_list_base<wabt::ModuleField>)->_M_string_length = 0;
    (((MemoryModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
    super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__ModuleField_0018d9f0;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((MemoryModuleField *)import._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->_M_local_buf +
     0x10) = (undefined4)local_c8;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((MemoryModuleField *)import._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->_M_local_buf +
     0x14) = local_c8._4_4_;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((MemoryModuleField *)import._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->_M_local_buf +
     0x18) = (undefined4)uStack_c0;
    *(undefined4 *)
     (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&(((MemoryModuleField *)import._M_head_impl)->
           super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc)->_M_local_buf +
     0x1c) = uStack_c0._4_4_;
    *(undefined4 *)
     &(((MemoryModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>)
      .super_ModuleField.loc = (undefined4)local_d8;
    *(undefined4 *)
     ((long)&(((MemoryModuleField *)import._M_head_impl)->
             super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc + 4) =
         local_d8._4_4_;
    *(undefined4 *)
     ((long)&(((MemoryModuleField *)import._M_head_impl)->
             super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc + 8) =
         (undefined4)uStack_d0;
    *(undefined4 *)
     ((long)&(((MemoryModuleField *)import._M_head_impl)->
             super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.loc + 0xc) =
         uStack_d0._4_4_;
    *(undefined4 *)
     &(((MemoryModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>)
      .super_ModuleField.type_ = 7;
    (((MemoryModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
    super_ModuleField._vptr_ModuleField = (_func_int **)&PTR__MemoryModuleField_0018e538;
    (((MemoryModuleField *)import._M_head_impl)->memory).name._M_dataplus =
         (_Alloc_hider)&(((MemoryModuleField *)import._M_head_impl)->memory).name.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&((MemoryModuleField *)import._M_head_impl)->memory,local_138._8_8_,
               (char *)(local_138._8_8_ + (long)local_128.field_1.offset));
    pLVar5 = &(((MemoryModuleField *)import._M_head_impl)->memory).page_limits;
    (((MemoryModuleField *)import._M_head_impl)->memory).page_limits.initial = 0;
    (((MemoryModuleField *)import._M_head_impl)->memory).page_limits.max = 0;
    *(undefined4 *)((long)&(((MemoryModuleField *)import._M_head_impl)->memory).page_limits.max + 7)
         = 0;
    RVar10 = ParseLimitsIndex(this,pLVar5);
    if (RVar10.enum_ != Error) {
      bVar9 = MatchLpar(this,Data);
      if (bVar9) {
        std::make_unique<wabt::DataSegmentModuleField,wabt::Location&>((Location *)local_138);
        uVar7 = local_138._0_8_;
        ppMVar1 = (module->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppMVar2 = (module->memories).
                  super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        GetToken((Token *)&local_78,this);
        local_b8.filename._M_len = local_78.loc.filename._M_len;
        Var::Var(&local_78,(Index)((ulong)((long)ppMVar1 - (long)ppMVar2) >> 3),&local_b8);
        Var::operator=(&((DataSegment *)(uVar7 + 0x40))->memory_var,&local_78);
        Var::~Var(&local_78);
        local_108 = (DataSegmentModuleField *)uVar7;
        local_110 = &((DataSegment *)(uVar7 + 0x40))->offset;
        bVar9 = (((MemoryModuleField *)import._M_head_impl)->memory).page_limits.is_64;
        local_78.loc.field_1.field_0.line = 0;
        local_78.loc.field_1.field_0.first_column = 0;
        local_78.loc.field_1.field_0.last_column = 0;
        local_78.loc.filename._M_len = 0;
        local_78.loc.filename._M_str._0_4_ = 0;
        local_78.loc.filename._M_str._4_4_ = 0;
        local_e8._M_head_impl = (Expr *)operator_new(0x90);
        ((local_e8._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
        ((local_e8._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
        ((local_e8._M_head_impl)->loc).filename._M_len = 0;
        ((local_e8._M_head_impl)->loc).filename._M_str = (char *)0x0;
        *(undefined8 *)((long)&((local_e8._M_head_impl)->loc).filename._M_str + 4) = 0;
        *(undefined8 *)((long)&((local_e8._M_head_impl)->loc).field_1.field_1.offset + 4) = 0;
        (local_e8._M_head_impl)->type_ = Const;
        (local_e8._M_head_impl)->_vptr_Expr = (_func_int **)&PTR__Expr_0018ddd8;
        local_e8._M_head_impl[1]._vptr_Expr = (_func_int **)local_78.loc.filename._M_len;
        local_e8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.next_ =
             (Expr *)CONCAT44(local_78.loc.filename._M_str._4_4_,local_78.loc.filename._M_str._0_4_)
        ;
        local_e8._M_head_impl[1].super_intrusive_list_base<wabt::Expr>.prev_ =
             (Expr *)CONCAT44(local_78.loc.field_1.field_0.first_column,
                              local_78.loc.field_1.field_0.line);
        local_e8._M_head_impl[1].loc.filename._M_len =
             CONCAT44(local_78.loc.field_1._12_4_,local_78.loc.field_1.field_0.last_column);
        local_e8._M_head_impl[1].loc.filename._M_str = (char *)~(ulong)bVar9;
        *(undefined4 *)&local_e8._M_head_impl[2]._vptr_Expr = 0;
        local_e8._M_head_impl[1].loc.field_1.field_1.offset = 0;
        *(undefined8 *)((long)&local_e8._M_head_impl[1].loc.field_1 + 8) = 0;
        intrusive_list<wabt::Expr>::push_back
                  (local_110,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8);
        if (local_e8._M_head_impl != (Expr *)0x0) {
          (*(local_e8._M_head_impl)->_vptr_Expr[1])();
        }
        pDVar8 = local_108;
        local_e8._M_head_impl = (Expr *)0x0;
        if ((local_108->data_segment).offset.size_ == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                        ,400,
                        "typename intrusive_list<T>::reference wabt::intrusive_list<wabt::Expr>::back() [T = wabt::Expr]"
                       );
        }
        pEVar3 = (local_108->data_segment).offset.last_;
        (pEVar3->loc).field_1.field_1.offset = local_c8;
        *(undefined8 *)((long)&(pEVar3->loc).field_1 + 8) = uStack_c0;
        (pEVar3->loc).filename._M_len = (size_t)local_d8;
        (pEVar3->loc).filename._M_str = uStack_d0;
        ParseTextListOpt(this,&(local_108->data_segment).data);
        RVar10 = Expect(this,Rpar);
        if (RVar10.enum_ != Error) {
          uVar11 = (ulong)((*(int *)&(pDVar8->data_segment).data.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(pDVar8->data_segment).data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start) + 0xffffU >> 0x10);
          (((MemoryModuleField *)import._M_head_impl)->memory).page_limits.initial = uVar11;
          (((MemoryModuleField *)import._M_head_impl)->memory).page_limits.max = uVar11;
          (((MemoryModuleField *)import._M_head_impl)->memory).page_limits.has_max = true;
          local_f0._M_head_impl = (MemoryModuleField *)import._M_head_impl;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_f0);
          if (local_f0._M_head_impl != (MemoryModuleField *)0x0) {
            (*((local_f0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_f0._M_head_impl = (MemoryModuleField *)0x0;
          local_f8._M_head_impl = (DataSegmentModuleField *)local_138._0_8_;
          local_138._0_8_ = (DataSegmentModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                      *)&local_f8);
          if (local_f8._M_head_impl != (DataSegmentModuleField *)0x0) {
            (*((local_f8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_f8._M_head_impl = (DataSegmentModuleField *)0x0;
          import._M_head_impl = (Import *)0x0;
        }
        if ((DataSegmentModuleField *)local_138._0_8_ != (DataSegmentModuleField *)0x0) {
          (*(((ModuleFieldMixin<(wabt::ModuleFieldType)8> *)local_138._0_8_)->super_ModuleField).
            _vptr_ModuleField[1])();
        }
        if (RVar10.enum_ != Error) {
LAB_00134274:
          if ((MemoryModuleField *)import._M_head_impl != (MemoryModuleField *)0x0) {
            (*(((MemoryModuleField *)import._M_head_impl)->
              super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField._vptr_ModuleField
              [1])(import._M_head_impl);
          }
          goto LAB_00134282;
        }
      }
      else {
        RVar10 = ParseLimits(this,pLVar5);
        if (RVar10.enum_ != Error) {
          local_100._M_head_impl = (MemoryModuleField *)import._M_head_impl;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_100);
          if (local_100._M_head_impl != (MemoryModuleField *)0x0) {
            (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_100._M_head_impl = (MemoryModuleField *)0x0;
          import._M_head_impl = (Import *)0x0;
          goto LAB_00134274;
        }
      }
    }
    if ((MemoryModuleField *)import._M_head_impl == (MemoryModuleField *)0x0) goto LAB_001342bc;
  }
  (*(((MemoryModuleField *)import._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
    super_ModuleField._vptr_ModuleField[1])(import._M_head_impl);
LAB_001342bc:
  pMVar4 = local_98.first_;
  while (pMVar4 != (ModuleField *)0x0) {
    ppp_Var6 = &pMVar4->_vptr_ModuleField;
    pMVar4 = (pMVar4->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*(*ppp_Var6)[1])();
  }
  if ((undefined1 *)local_138._8_8_ != local_128.field2 + 8) {
    operator_delete((void *)local_138._8_8_,CONCAT71(local_128._9_7_,local_128.field2[8]) + 1);
  }
  return (Result)EVar12;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimitsIndex(&field->memory.page_limits));
    if (MatchLpar(TokenType::Data)) {
      auto data_segment_field = std::make_unique<DataSegmentModuleField>(loc);
      DataSegment& data_segment = data_segment_field->data_segment;
      data_segment.memory_var = Var(module->memories.size(), GetLocation());
      data_segment.offset.push_back(std::make_unique<ConstExpr>(
          field->memory.page_limits.is_64 ? Const::I64(0) : Const::I32(0)));
      data_segment.offset.back().loc = loc;
      ParseTextListOpt(&data_segment.data);
      EXPECT(Rpar);

      uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
      uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
      field->memory.page_limits.initial = page_size;
      field->memory.page_limits.max = page_size;
      field->memory.page_limits.has_max = true;

      module->AppendField(std::move(field));
      module->AppendField(std::move(data_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&field->memory.page_limits));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}